

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O1

const_varint_iterator<long> * __thiscall
protozero::const_varint_iterator<long>::operator++(const_varint_iterator<long> *this)

{
  char *pcVar1;
  char *pcVar2;
  assert_error *this_00;
  undefined8 *puVar3;
  char *pcVar4;
  pointer_____offset_0x10___ *ppuVar5;
  char *pcVar6;
  bool bVar7;
  
  pcVar1 = this->m_data;
  if (pcVar1 == (char *)0x0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"m_data");
    __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = this->m_end;
  bVar7 = pcVar1 == pcVar2;
  pcVar4 = pcVar1;
  if (!bVar7) {
    pcVar6 = pcVar1;
    if (*pcVar1 < '\0') {
      do {
        pcVar6 = pcVar6 + 1;
        bVar7 = pcVar6 == pcVar2;
        pcVar4 = pcVar2;
        if (bVar7) break;
        pcVar4 = pcVar6;
      } while (*pcVar6 < '\0');
    }
    else {
      bVar7 = false;
    }
  }
  if ((long)pcVar4 - (long)pcVar1 < 10) {
    if (!bVar7) {
      this->m_data = pcVar4 + 1;
      return this;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_002581d0;
    ppuVar5 = &end_of_buffer_exception::typeinfo;
  }
  else {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_002581a8;
    ppuVar5 = &varint_too_long_exception::typeinfo;
  }
  __cxa_throw(puVar3,ppuVar5,std::exception::~exception);
}

Assistant:

const_varint_iterator& operator++() {
        protozero_assert(m_data);
        skip_varint(&m_data, m_end);
        return *this;
    }